

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O0

void __thiscall
Volume::visualizeVisualSpace
          (Volume *this,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *_obstcs,Vector2d *obs,Mat *dst)

{
  double dVar1;
  bool bVar2;
  int _x;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *vec;
  ulong uVar3;
  CoeffReturnType pdVar4;
  Scalar_<double> *this_00;
  long in_RDI;
  Object *obj;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Object,_std::allocator<Object>_> *__range1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  polygons;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffd64;
  Mat *in_stack_fffffffffffffd68;
  Point_<int> *pPVar6;
  Volume *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  Scalar_<double> *in_stack_fffffffffffffd80;
  undefined1 local_238 [32];
  Point_<int> local_218;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *in_stack_fffffffffffffdf0;
  Vector2d *in_stack_fffffffffffffdf8;
  Object *in_stack_fffffffffffffe00;
  undefined1 local_1f8 [32];
  Point_<int> local_1d8;
  undefined1 local_1d0 [24];
  Point_<int> local_1b8;
  undefined1 local_1b0 [32];
  _InputArray local_190;
  undefined1 local_178 [24];
  Point_<int> local_160;
  undefined1 local_158 [32];
  _InputArray local_138;
  undefined1 local_120 [40];
  reference local_f8;
  Object *local_f0;
  __normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_> local_e8;
  long local_e0;
  undefined1 local_c0 [32];
  Rect_<int> local_a0;
  undefined1 local_90 [24];
  undefined1 local_78 [48];
  Rect_<int> local_48;
  undefined1 local_38 [56];
  
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  cv::Rect_<int>::Rect_(&local_48,&walls);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffd80,
             (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68,
             (double)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  cv::rectangle(local_38,&local_48,local_78,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c579);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  cv::Rect_<int>::Rect_(&local_a0,&floors);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffd80,
             (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68,
             (double)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  cv::rectangle(local_90,&local_a0,local_c0,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c5fe);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)0x15c60b);
  local_e0 = in_RDI + 0x20;
  local_e8._M_current =
       (Object *)std::vector<Object,_std::allocator<Object>_>::begin(in_stack_fffffffffffffd58);
  local_f0 = (Object *)std::vector<Object,_std::allocator<Object>_>::end(in_stack_fffffffffffffd58);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       (__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                        *)in_stack_fffffffffffffd58);
    if (!bVar2) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
               operator*(&local_e8);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffd58);
    Object::makePolygons4Render
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    __gnu_cxx::__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
    operator++(&local_e8);
  }
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  cv::_InputArray::_InputArray<cv::Point_<int>>
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)in_stack_fffffffffffffd58);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffd80,
             (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68,
             (double)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  vec = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)cv::noArray();
  cv::Point_<int>::Point_(&local_160);
  pPVar6 = &local_160;
  uVar5 = 0x7fffffff;
  cv::drawContours(local_120,&local_138,0xffffffff,local_158,0xffffffff,8);
  cv::_InputArray::~_InputArray(&local_138);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c801);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,(Mat *)pPVar6);
  cv::_InputArray::_InputArray<cv::Point_<int>>
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffd64,uVar5),vec);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffd80,
             (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)pPVar6,
             (double)CONCAT44(in_stack_fffffffffffffd64,uVar5));
  uVar3 = cv::noArray();
  cv::Point_<int>::Point_(&local_1b8);
  pPVar6 = &local_1b8;
  uVar5 = 0x7fffffff;
  cv::drawContours(local_178,&local_190,0xffffffff,local_1b0,0xffffffff,8,uVar3);
  cv::_InputArray::~_InputArray(&local_190);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c8d0);
  prettier(in_stack_fffffffffffffd70,(Mat *)pPVar6,
           (Vector2d *)CONCAT44(in_stack_fffffffffffffd64,uVar5));
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,(Mat *)pPVar6);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)0x15c910);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)0x15c931);
  cv::Point_<int>::Point_(&local_1d8,(int)dVar1,(int)*pdVar4);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffd80,
             (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)pPVar6,
             (double)CONCAT44(in_stack_fffffffffffffd64,uVar5));
  uVar3 = uVar3 & 0xffffffff00000000;
  cv::circle(local_1d0,&local_1d8,4,local_1f8,0xffffffff,8,uVar3);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c9ba);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd70,(Mat *)pPVar6);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)0x15c9de);
  _x = (int)*pdVar4;
  this_00 = (Scalar_<double> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)0x15c9ff);
  cv::Point_<int>::Point_
            (&local_218,_x,(int)(this_00->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0]);
  cv::Scalar_<double>::Scalar_
            (this_00,(double)CONCAT44(_x,in_stack_fffffffffffffd78),
             (double)in_stack_fffffffffffffd70,(double)pPVar6,
             (double)CONCAT44(in_stack_fffffffffffffd64,uVar5));
  cv::circle(&stack0xfffffffffffffdf0,&local_218,7,local_238,2,8,uVar3 & 0xffffffff00000000);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15ca82);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void Volume::visualizeVisualSpace(const std::vector<Obstacle>& _obstcs, const Eigen::Vector2d& obs, cv::Mat& dst) const {
    cv::rectangle(dst, walls, cv::Scalar(10, 10, 10), -1);
    cv::rectangle(dst, floors, cv::Scalar(40, 40, 40), -1);
    std::vector<std::vector<cv::Point>> polygons;
    for (const Object& obj: objs)
        obj.makePolygons4Render(obs, polygons);
    cv::drawContours(dst, polygons, -1, cv::Scalar(254, 254, 254), -1);
    cv::drawContours(dst, _obstcs, -1, cv::Scalar(10, 10, 10), -1);
    prettier(dst, obs);
    cv::circle(dst, cv::Point(obs.x(), obs.y()), 4, cv::Scalar(0, 255, 255), -1);
    cv::circle(dst, cv::Point(obs.x(), obs.y()), 7, cv::Scalar(40, 40, 40), 2);
}